

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

uint aom_avg_8x8_c(uint8_t *s,int p)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  int iVar12;
  uint8_t *puVar13;
  int iVar14;
  
  puVar13 = s + 4;
  iVar14 = 0;
  iVar12 = 8;
  do {
    uVar1 = *(undefined4 *)(puVar13 + -4);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar8;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar8;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar10._5_8_ = 0;
    auVar10._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar8;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
    uVar1 = *(undefined4 *)puVar13;
    uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar9;
    auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar6[8] = (char)((uint)uVar1 >> 0x10);
    auVar6._0_8_ = uVar9;
    auVar6[9] = 0;
    auVar6._10_3_ = auVar5._10_3_;
    auVar11._5_8_ = 0;
    auVar11._0_5_ = auVar6._8_5_;
    auVar7[4] = (char)((uint)uVar1 >> 8);
    auVar7._0_4_ = (int)uVar9;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
    iVar14 = (uint)(uint3)(auVar5._10_3_ >> 0x10) + (uint)(uint3)(auVar2._10_3_ >> 0x10) +
             auVar7._4_4_ + auVar4._4_4_ +
             auVar6._8_4_ + auVar3._8_4_ + (int)uVar9 + (int)uVar8 + iVar14;
    puVar13 = puVar13 + p;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  return iVar14 + 0x20 >> 6;
}

Assistant:

unsigned int aom_avg_8x8_c(const uint8_t *s, int p) {
  int i, j;
  int sum = 0;
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}